

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int Run<std::_Bind<int(*(std::__cxx11::string))(std::__cxx11::string_const&)>>
              (_Bind<int_(*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *f,size_t retries)

{
  int iVar1;
  long lVar2;
  string asStack_228 [32];
  undefined1 local_208 [40];
  undefined1 local_1e0 [40];
  stringstream stream;
  ostream local_1a8 [376];
  
  std::
  _Bind<int_(*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::_Bind((_Bind<int_(*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           *)local_1e0,f);
  iVar1 = TryRun<std::_Bind<int(*(std::__cxx11::string))(std::__cxx11::string_const&)>>
                    ((_Bind<int_(*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)local_1e0);
  std::__cxx11::string::~string((string *)(local_1e0 + 8));
  if (retries != 0 && iVar1 != 0) {
    lVar2 = retries + 1;
    do {
      lVar2 = lVar2 + -1;
      if (lVar2 == 0) {
        std::__cxx11::stringstream::stringstream((stringstream *)&stream);
        std::operator<<(local_1a8,"Too many retries, giving up!\n");
        std::__cxx11::stringbuf::str();
        Logger::Log(3,asStack_228);
        std::__cxx11::string::~string(asStack_228);
        std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
        return iVar1;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&stream);
      std::operator<<(local_1a8,"Command failed, retrying...\n");
      std::__cxx11::stringbuf::str();
      Logger::Log(2,asStack_228);
      std::__cxx11::string::~string(asStack_228);
      std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
      _stream = 1;
      std::this_thread::sleep_for<long,std::ratio<1l,1l>>
                ((duration<long,_std::ratio<1L,_1L>_> *)&stream);
      std::
      _Bind<int_(*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::_Bind((_Bind<int_(*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)local_208,f);
      iVar1 = TryRun<std::_Bind<int(*(std::__cxx11::string))(std::__cxx11::string_const&)>>
                        ((_Bind<int_(*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)local_208);
      std::__cxx11::string::~string((string *)(local_208 + 8));
    } while (iVar1 != 0);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int Run(T f, size_t retries)
{
    auto result = TryRun(f);

    // success or no retry allowed
    if (!result || !retries) {
        return result;
    }

    while (retries-- > 0) {
        LOG_WARN("Command failed, retrying...\n");
        std::this_thread::sleep_for(std::chrono::seconds(1));
        result = TryRun(f);
        if (!result) {
            return 0;
        }
    }
    LOG_ERROR("Too many retries, giving up!\n");
    return result;
}